

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetC.c
# Opt level: O1

void fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(uint64_t *out1,uint64_t *arg1)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  ulong uVar121;
  ulong uVar122;
  ulong uVar123;
  ulong uVar124;
  ulong uVar125;
  ulong uVar126;
  ulong uVar127;
  ulong uVar128;
  ulong uVar129;
  ulong uVar130;
  ulong uVar131;
  ulong uVar132;
  
  uVar129 = arg1[9];
  uVar127 = uVar129 * 0x472;
  uVar124 = arg1[8];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar129 * 0x239;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = uVar129;
  uVar125 = arg1[7];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar124;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uVar127;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar124 * 0x239;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar124;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar125;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uVar127;
  uVar123 = uVar124 * 0x8e4;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar125;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = uVar123;
  uVar128 = uVar125 * 0x472;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar128;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = uVar125;
  uVar122 = arg1[6];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar122;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uVar129 * 0x8e4;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar122;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar123;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar122;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = uVar125 * 0x8e4;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar122 * 0x472;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = uVar122;
  uVar126 = arg1[5];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar126;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = uVar127;
  uVar130 = uVar124 * 0x472;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar126;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = uVar130;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar126;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = uVar128;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar126;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = uVar122 * 0x472;
  uVar131 = uVar126 * 2;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar126 * 0x239;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = uVar126;
  uVar126 = arg1[4];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar126;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = uVar127;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar126;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = uVar130;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar126;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = uVar128;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar126;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = uVar122 * 0x8e4;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar126;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = uVar131;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar126;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = uVar126;
  uVar128 = arg1[3];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar128;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = uVar127;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar128;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = uVar130;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar128;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = uVar125 * 0x8e4;
  uVar121 = uVar122 << 2;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar128;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = uVar121;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar128;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = uVar131;
  uVar132 = uVar126 * 2;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar128;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = uVar132;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar128;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = uVar128;
  uVar130 = arg1[2];
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar130;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = uVar127;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar130;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = uVar123;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar130;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = uVar125 << 2;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar130;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = uVar121;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar130;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = uVar131;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar130;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = uVar132;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar130;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = uVar128 << 2;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar130 * 2;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = uVar130;
  uVar123 = arg1[1];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar123;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = uVar129 * 0x8e4;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar123;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = uVar124 << 2;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar123;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = uVar125 << 2;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar123;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = uVar121;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar123;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = uVar131;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = uVar123;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = uVar126 << 2;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar123;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = uVar128 << 2;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar123;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = uVar130 << 2;
  uVar126 = *arg1;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar123 * 2;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = uVar123;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar126;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = uVar129 * 2;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uVar126;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = uVar124 * 2;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar126;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = uVar125 * 2;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = uVar126;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = uVar122 * 2;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar126;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = uVar131;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uVar126;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = uVar132;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uVar126;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = uVar128 * 2;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = uVar126;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = uVar130 * 2;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uVar126;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = uVar123 * 2;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = uVar126;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = uVar126;
  auVar15 = auVar55 * auVar111 +
            auVar30 * auVar86 + auVar15 * auVar71 + auVar19 * auVar75 + auVar24 * auVar80 +
            auVar37 * auVar93;
  auVar14 = (auVar15 >> 0x34) +
            auVar29 * auVar85 + auVar23 * auVar79 + auVar14 * auVar70 + auVar18 * auVar74 +
            auVar54 * auVar110;
  uVar124 = auVar14._0_8_;
  uVar129 = auVar14._8_8_;
  auVar118._8_8_ = uVar129 >> 0x33;
  auVar118._0_8_ = uVar129 * 0x2000 | uVar124 >> 0x33;
  auVar118 = auVar45 * auVar101 +
             auVar22 * auVar78 + auVar17 * auVar73 + auVar13 * auVar69 + auVar10 * auVar66 +
             auVar53 * auVar109 + auVar118;
  uVar130 = auVar118._0_8_;
  uVar129 = auVar118._8_8_;
  auVar117._8_8_ = uVar129 >> 0x33;
  auVar117._0_8_ = uVar129 * 0x2000 | uVar130 >> 0x33;
  auVar117 = auVar52 * auVar108 +
             auVar44 * auVar100 + auVar16 * auVar72 + auVar12 * auVar68 + auVar9 * auVar65 +
             auVar117;
  uVar129 = auVar117._0_8_;
  uVar125 = auVar117._8_8_;
  auVar116._8_8_ = uVar125 >> 0x33;
  auVar116._0_8_ = uVar125 * 0x2000 | uVar129 >> 0x33;
  auVar116 = auVar36 * auVar92 + auVar11 * auVar67 + auVar8 * auVar64 + auVar6 * auVar62 +
             auVar43 * auVar99 + auVar51 * auVar107 + auVar116;
  uVar126 = auVar116._0_8_;
  uVar125 = auVar116._8_8_;
  auVar120._8_8_ = uVar125 >> 0x33;
  auVar120._0_8_ = uVar125 * 0x2000 | uVar126 >> 0x33;
  auVar120 = auVar50 * auVar106 +
             auVar42 * auVar98 + auVar35 * auVar91 + auVar7 * auVar63 + auVar5 * auVar61 + auVar120;
  uVar128 = auVar120._0_8_;
  uVar125 = auVar120._8_8_;
  auVar115._8_8_ = uVar125 >> 0x34;
  auVar115._0_8_ = uVar125 * 0x1000 | uVar128 >> 0x34;
  auVar115 = auVar41 * auVar97 +
             auVar34 * auVar90 + auVar28 * auVar84 + auVar3 * auVar59 + auVar4 * auVar60 +
             auVar49 * auVar105 + auVar115;
  uVar123 = auVar115._0_8_;
  uVar125 = auVar115._8_8_;
  auVar114._8_8_ = uVar125 >> 0x33;
  auVar114._0_8_ = uVar125 * 0x2000 | uVar123 >> 0x33;
  auVar114 = auVar48 * auVar104 +
             auVar40 * auVar96 + auVar33 * auVar89 + auVar2 * auVar58 + auVar27 * auVar83 + auVar114
  ;
  uVar131 = auVar114._0_8_;
  uVar125 = auVar114._8_8_;
  auVar119._8_8_ = uVar125 >> 0x33;
  auVar119._0_8_ = uVar125 * 0x2000 | uVar131 >> 0x33;
  auVar119 = auVar47 * auVar103 +
             auVar39 * auVar95 +
             auVar32 * auVar88 + auVar26 * auVar82 + auVar21 * auVar77 + auVar1 * auVar57 + auVar119
  ;
  uVar132 = auVar119._0_8_;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = auVar119._8_8_ * 0x2000 | uVar132 >> 0x33;
  auVar113 = auVar46 * auVar102 +
             auVar38 * auVar94 + auVar31 * auVar87 + auVar20 * auVar76 + auVar25 * auVar81 +
             auVar113;
  uVar122 = auVar113._0_8_;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = auVar113._8_8_ * 0x2000 | uVar122 >> 0x33;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = auVar15._0_8_ & 0xfffffffffffff;
  auVar112 = auVar56 * ZEXT816(0x239) + auVar112;
  uVar125 = auVar112._0_8_;
  uVar124 = (auVar112._8_8_ << 0xc | uVar125 >> 0x34) + (uVar124 & 0x7ffffffffffff);
  *out1 = uVar125 & 0xfffffffffffff;
  out1[1] = uVar124 & 0x7ffffffffffff;
  out1[2] = (uVar124 >> 0x33) + (uVar130 & 0x7ffffffffffff);
  out1[3] = uVar129 & 0x7ffffffffffff;
  out1[4] = uVar126 & 0x7ffffffffffff;
  out1[5] = uVar128 & 0xfffffffffffff;
  out1[6] = uVar123 & 0x7ffffffffffff;
  out1[7] = uVar131 & 0x7ffffffffffff;
  out1[8] = uVar132 & 0x7ffffffffffff;
  out1[9] = uVar122 & 0x7ffffffffffff;
  return;
}

Assistant:

static void fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(
    uint64_t out1[10], const uint64_t arg1[10]) {
    uint64_t x1;
    uint64_t x2;
    uint64_t x3;
    uint64_t x4;
    uint64_t x5;
    uint64_t x6;
    uint64_t x7;
    uint64_t x8;
    uint64_t x9;
    uint64_t x10;
    uint64_t x11;
    uint64_t x12;
    uint64_t x13;
    uint64_t x14;
    uint64_t x15;
    uint64_t x16;
    uint64_t x17;
    uint64_t x18;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x19;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x20;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x21;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x22;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x23;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x24;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x25;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x26;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x27;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x28;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x29;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x30;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x31;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x32;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x33;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x34;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x35;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x36;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x37;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x38;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x39;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x40;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x41;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x42;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x43;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x44;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x45;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x46;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x47;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x48;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x49;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x50;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x51;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x52;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x53;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x54;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x55;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x56;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x57;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x58;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x59;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x60;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x61;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x62;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x63;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x64;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x65;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x66;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x67;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x68;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x69;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x70;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x71;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x72;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x73;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x74;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x75;
    uint64_t x76;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x77;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x78;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x79;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x80;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x81;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x82;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x83;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x84;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x85;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x86;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x87;
    uint64_t x88;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x89;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x90;
    uint64_t x91;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x92;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x93;
    uint64_t x94;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x95;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x96;
    uint64_t x97;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x98;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x99;
    uint64_t x100;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x101;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x102;
    uint64_t x103;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x104;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x105;
    uint64_t x106;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x107;
    uint64_t x108;
    uint64_t x109;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x110;
    uint64_t x111;
    uint64_t x112;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x113;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128 x114;
    uint64_t x115;
    uint64_t x116;
    uint64_t x117;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 x118;
    uint64_t x119;
    uint64_t x120;
    x1 = ((arg1[9]) * UINT16_C(0x239));
    x2 = (x1 * 0x2);
    x3 = ((arg1[9]) * 0x2);
    x4 = ((arg1[8]) * UINT16_C(0x239));
    x5 = (x4 * 0x2);
    x6 = ((arg1[8]) * 0x2);
    x7 = ((arg1[7]) * UINT16_C(0x239));
    x8 = (x7 * 0x2);
    x9 = ((arg1[7]) * 0x2);
    x10 = ((arg1[6]) * UINT16_C(0x239));
    x11 = (x10 * 0x2);
    x12 = ((arg1[6]) * 0x2);
    x13 = ((arg1[5]) * UINT16_C(0x239));
    x14 = ((arg1[5]) * 0x2);
    x15 = ((arg1[4]) * 0x2);
    x16 = ((arg1[3]) * 0x2);
    x17 = ((arg1[2]) * 0x2);
    x18 = ((arg1[1]) * 0x2);
    x19 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[9]) * x1);
    x20 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[8]) * x2);
    x21 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[8]) * x4);
    x22 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[7]) * x2);
    x23 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[7]) *
           (x5 * 0x2));
    x24 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[7]) *
           (x7 * 0x2));
    x25 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[6]) *
           (x2 * 0x2));
    x26 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[6]) *
           (x5 * 0x2));
    x27 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[6]) *
           (x8 * 0x2));
    x28 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[6]) *
           (x10 * 0x2));
    x29 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[5]) * x2);
    x30 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[5]) * x5);
    x31 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[5]) * x8);
    x32 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[5]) * x11);
    x33 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[5]) * x13);
    x34 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[4]) * x2);
    x35 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[4]) * x5);
    x36 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[4]) * x8);
    x37 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[4]) *
           (x11 * 0x2));
    x38 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[4]) * x14);
    x39 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[4]) *
           (arg1[4]));
    x40 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[3]) * x2);
    x41 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[3]) * x5);
    x42 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[3]) *
           (x8 * 0x2));
    x43 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[3]) *
           (x12 * 0x2));
    x44 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[3]) * x14);
    x45 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[3]) * x15);
    x46 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[3]) *
           (arg1[3]));
    x47 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[2]) * x2);
    x48 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[2]) *
           (x5 * 0x2));
    x49 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[2]) *
           (x9 * 0x2));
    x50 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[2]) *
           (x12 * 0x2));
    x51 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[2]) * x14);
    x52 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[2]) * x15);
    x53 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[2]) *
           (x16 * 0x2));
    x54 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[2]) *
           ((arg1[2]) * 0x2));
    x55 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[1]) *
           (x2 * 0x2));
    x56 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[1]) *
           (x6 * 0x2));
    x57 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[1]) *
           (x9 * 0x2));
    x58 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[1]) *
           (x12 * 0x2));
    x59 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[1]) * x14);
    x60 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[1]) *
           (x15 * 0x2));
    x61 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[1]) *
           (x16 * 0x2));
    x62 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[1]) *
           (x17 * 0x2));
    x63 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[1]) *
           ((arg1[1]) * 0x2));
    x64 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[0]) * x3);
    x65 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[0]) * x6);
    x66 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[0]) * x9);
    x67 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[0]) * x12);
    x68 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[0]) * x14);
    x69 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[0]) * x15);
    x70 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[0]) * x16);
    x71 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[0]) * x17);
    x72 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[0]) * x18);
    x73 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)(arg1[0]) *
           (arg1[0]));
    x74 = (x73 + (x55 + (x48 + (x42 + (x37 + x33)))));
    x75 = (x74 >> 52);
    x76 = (uint64_t)(x74 & UINT64_C(0xfffffffffffff));
    x77 = (x64 + (x56 + (x49 + (x43 + x38))));
    x78 = (x65 + (x57 + (x50 + (x44 + (x39 + x19)))));
    x79 = (x66 + (x58 + (x51 + (x45 + x20))));
    x80 = (x67 + (x59 + (x52 + (x46 + (x22 + x21)))));
    x81 = (x68 + (x60 + (x53 + (x25 + x23))));
    x82 = (x69 + (x61 + (x54 + (x29 + (x26 + x24)))));
    x83 = (x70 + (x62 + (x34 + (x30 + x27))));
    x84 = (x71 + (x63 + (x40 + (x35 + (x31 + x28)))));
    x85 = (x72 + (x47 + (x41 + (x36 + x32))));
    x86 = (x75 + x85);
    x87 = (x86 >> 51);
    x88 = (uint64_t)(x86 & UINT64_C(0x7ffffffffffff));
    x89 = (x87 + x84);
    x90 = (x89 >> 51);
    x91 = (uint64_t)(x89 & UINT64_C(0x7ffffffffffff));
    x92 = (x90 + x83);
    x93 = (x92 >> 51);
    x94 = (uint64_t)(x92 & UINT64_C(0x7ffffffffffff));
    x95 = (x93 + x82);
    x96 = (x95 >> 51);
    x97 = (uint64_t)(x95 & UINT64_C(0x7ffffffffffff));
    x98 = (x96 + x81);
    x99 = (x98 >> 52);
    x100 = (uint64_t)(x98 & UINT64_C(0xfffffffffffff));
    x101 = (x99 + x80);
    x102 = (x101 >> 51);
    x103 = (uint64_t)(x101 & UINT64_C(0x7ffffffffffff));
    x104 = (x102 + x79);
    x105 = (x104 >> 51);
    x106 = (uint64_t)(x104 & UINT64_C(0x7ffffffffffff));
    x107 = (x105 + x78);
    x108 = (uint64_t)(x107 >> 51);
    x109 = (uint64_t)(x107 & UINT64_C(0x7ffffffffffff));
    x110 = (x108 + x77);
    x111 = (uint64_t)(x110 >> 51);
    x112 = (uint64_t)(x110 & UINT64_C(0x7ffffffffffff));
    x113 = ((fiat_id_tc26_gost_3410_2012_512_paramSetC_uint128)UINT16_C(0x239) *
            x111);
    x114 = (x76 + x113);
    x115 = (uint64_t)(x114 >> 52);
    x116 = (uint64_t)(x114 & UINT64_C(0xfffffffffffff));
    x117 = (x115 + x88);
    x118 = (fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1)(x117 >> 51);
    x119 = (x117 & UINT64_C(0x7ffffffffffff));
    x120 = (x118 + x91);
    out1[0] = x116;
    out1[1] = x119;
    out1[2] = x120;
    out1[3] = x94;
    out1[4] = x97;
    out1[5] = x100;
    out1[6] = x103;
    out1[7] = x106;
    out1[8] = x109;
    out1[9] = x112;
}